

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_uint32 ma_get_format_priority_index(ma_format format)

{
  uint local_14;
  ma_uint32 i;
  ma_format format_local;
  
  local_14 = 0;
  while( true ) {
    if (4 < local_14) {
      return 0xffffffff;
    }
    if (g_maFormatPriorities[local_14] == format) break;
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

MA_API ma_uint32 ma_get_format_priority_index(ma_format format) /* Lower = better. */
{
    ma_uint32 i;
    for (i = 0; i < ma_countof(g_maFormatPriorities); ++i) {
        if (g_maFormatPriorities[i] == format) {
            return i;
        }
    }

    /* Getting here means the format could not be found or is equal to ma_format_unknown. */
    return (ma_uint32)-1;
}